

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_send_chunk(mg_connection *conn,char *chunk,uint chunk_len)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t len;
  int iVar4;
  char lenbuf [16];
  char acStack_48 [24];
  
  sprintf(acStack_48,"%x\r\n");
  len = strlen(acStack_48);
  iVar1 = mg_write(conn,acStack_48,len);
  iVar4 = -1;
  if (iVar1 == (int)len) {
    uVar2 = mg_write(conn,chunk,(ulong)chunk_len);
    if (uVar2 == chunk_len) {
      iVar3 = mg_write(conn,"\r\n",2);
      if (iVar3 == 2) {
        iVar4 = iVar1 + chunk_len + 2;
      }
    }
  }
  return iVar4;
}

Assistant:

CIVETWEB_API int
mg_send_chunk(struct mg_connection *conn,
              const char *chunk,
              unsigned int chunk_len)
{
	char lenbuf[16];
	size_t lenbuf_len;
	int ret;
	int t;

	/* First store the length information in a text buffer. */
	sprintf(lenbuf, "%x\r\n", chunk_len);
	lenbuf_len = strlen(lenbuf);

	/* Then send length information, chunk and terminating \r\n. */
	ret = mg_write(conn, lenbuf, lenbuf_len);
	if (ret != (int)lenbuf_len) {
		return -1;
	}
	t = ret;

	ret = mg_write(conn, chunk, chunk_len);
	if (ret != (int)chunk_len) {
		return -1;
	}
	t += ret;

	ret = mg_write(conn, "\r\n", 2);
	if (ret != 2) {
		return -1;
	}
	t += ret;

	return t;
}